

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_DCData.cpp
# Opt level: O1

h__Writer * __thiscall
ASDCP::DCData::MXFWriter::h__Writer::OpenWrite
          (h__Writer *this,string *filename,ui32_t HeaderSize,SubDescriptorList_t *subDescriptors)

{
  DCDataDescriptor *this_00;
  _List_node_base *p_Var1;
  long *plVar2;
  undefined1 *puVar3;
  long *in_R8;
  Result_t aRStack_98 [104];
  
  if (*(int *)&filename[0x1b].field_2 == 0) {
    Kumu::FileWriter::OpenWrite((string *)this);
    if (-1 < *(int *)&(this->super_h__ASDCPWriter).super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.
                      _vptr_TrackFileWriter) {
      *(int *)&filename[2]._M_string_length = (int)subDescriptors;
      this_00 = (DCDataDescriptor *)operator_new(0x170);
      MXF::DCDataDescriptor::DCDataDescriptor(this_00,(Dictionary *)filename->_M_string_length);
      *(DCDataDescriptor **)((long)&filename[0x18].field_2 + 8) = this_00;
      plVar2 = in_R8;
      while (plVar2 = (long *)*plVar2, plVar2 != in_R8) {
        p_Var1 = (_List_node_base *)operator_new(0x18);
        p_Var1[1]._M_next = (_List_node_base *)plVar2[2];
        std::__detail::_List_node_base::_M_hook(p_Var1);
        filename[0x19].field_2._M_allocated_capacity =
             filename[0x19].field_2._M_allocated_capacity + 1;
        Kumu::GenRandomValue((UUID *)(plVar2[2] + 0x58));
        std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>::push_back
                  ((vector<Kumu::UUID,_std::allocator<Kumu::UUID>_> *)
                   (*(long *)((long)&filename[0x18].field_2 + 8) + 200),
                   (value_type *)(plVar2[2] + 0x58));
      }
      if (*(int *)&filename[0x1b].field_2 == 0) {
        *(undefined4 *)&filename[0x1b].field_2 = 1;
        puVar3 = Kumu::RESULT_OK;
      }
      else {
        puVar3 = Kumu::RESULT_STATE;
      }
      Kumu::Result_t::Result_t(aRStack_98,(Result_t *)puVar3);
      Kumu::Result_t::operator=((Result_t *)this,aRStack_98);
      Kumu::Result_t::~Result_t(aRStack_98);
    }
  }
  else {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_STATE);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::DCData::MXFWriter::h__Writer::OpenWrite(const std::string& filename, ui32_t HeaderSize,
                                    const SubDescriptorList_t& subDescriptors)
{
  if ( ! m_State.Test_BEGIN() )
    return RESULT_STATE;

  Result_t result = m_File.OpenWrite(filename);

  if ( ASDCP_SUCCESS(result) )
    {
      m_HeaderSize = HeaderSize;
      m_EssenceDescriptor = new MXF::DCDataDescriptor(m_Dict);
      SubDescriptorList_t::const_iterator sDObj;
      SubDescriptorList_t::const_iterator lastDescriptor = subDescriptors.end();
      for (sDObj = subDescriptors.begin(); sDObj != lastDescriptor; ++sDObj)
      {
          m_EssenceSubDescriptorList.push_back(*sDObj);
          GenRandomValue((*sDObj)->InstanceUID);
          m_EssenceDescriptor->SubDescriptors.push_back((*sDObj)->InstanceUID);
      }
      result = m_State.Goto_INIT();
    }

  return result;
}